

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::IsPathToFramework(string *path)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(path);
  if ((bVar1) && (9 < path->_M_string_length)) {
    iVar2 = strcmp((path->_M_dataplus)._M_p + (path->_M_string_length - 10),".framework");
    bVar1 = iVar2 == 0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmSystemTools::IsPathToFramework(const std::string& path)
{
  return (cmSystemTools::FileIsFullPath(path) &&
          cmHasLiteralSuffix(path, ".framework"));
}